

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::cmGeneratorTarget(cmGeneratorTarget *this,cmTarget *t,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  cmGlobalGenerator *pcVar2;
  _WordT _Var3;
  _WordT _Var4;
  _WordT _Var5;
  cmMakefile *pcVar6;
  string *psVar7;
  PolicyMap *pPVar8;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  _Var9;
  cmStringRange cVar10;
  cmBacktraceRange cVar11;
  cmBacktraceRange backtraces;
  cmBacktraceRange backtraces_00;
  cmBacktraceRange backtraces_01;
  cmBacktraceRange backtraces_02;
  cmBacktraceRange backtraces_03;
  cmBacktraceRange backtraces_04;
  cmBacktraceRange backtraces_05;
  allocator<char> local_129 [9];
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_120;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_118;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_110;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_108;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_100;
  string local_50;
  
  this->Target = t;
  (this->ObjectDirectory)._M_dataplus._M_p = (pointer)&(this->ObjectDirectory).field_2;
  (this->ObjectDirectory)._M_string_length = 0;
  (this->ObjectDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->FortranModuleDirectoryCreated = false;
  (this->FortranModuleDirectory)._M_dataplus._M_p = (pointer)&(this->FortranModuleDirectory).field_2
  ;
  (this->FortranModuleDirectory)._M_string_length = 0;
  (this->FortranModuleDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->SourceDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Objects)._M_t._M_impl.super__Rb_tree_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Var9._M_current = (cmListFileBacktrace *)&(this->ExportMacro).field_2;
  (this->ExportMacro)._M_dataplus._M_p = (pointer)_Var9._M_current;
  (this->ExportMacro)._M_string_length = 0;
  (this->ExportMacro).field_2._M_local_buf[0] = '\0';
  this->SourceFileFlagsConstructed = false;
  p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_100 = &this->IncludeDirectoriesEntries;
  local_108 = &this->CompileOptionsEntries;
  local_110 = &this->CompileFeaturesEntries;
  local_118 = &this->CompileDefinitionsEntries;
  local_120 = &this->LinkOptionsEntries;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,200);
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->UtilityItems)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)(this->PolicyMap).Status.super__Base_bitset<5UL>._M_w + 0x21) = 0;
  this->PolicyReportedCMP0069 = false;
  this->DebugIncludesDone = false;
  this->DebugCompileOptionsDone = false;
  this->DebugCompileFeaturesDone = false;
  this->DebugCompileDefinitionsDone = false;
  this->DebugLinkOptionsDone = false;
  this->DebugLinkDirectoriesDone = false;
  this->DebugSourcesDone = false;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[4] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[2] = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[0] = 0;
  this->LinkImplementationLanguageIsContextDependent = true;
  this->UtilityItemsDone = false;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar6 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar6;
  this->LocalGenerator = lg;
  pcVar2 = lg->GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  (*pcVar2->_vptr_cmGlobalGenerator[0x2c])(pcVar2,this);
  cVar10 = cmTarget::GetIncludeDirectoriesEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetIncludeDirectoriesBacktraces(t);
  backtraces.End._M_current = _Var9._M_current;
  backtraces.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces,local_100,false);
  cVar10 = cmTarget::GetCompileOptionsEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetCompileOptionsBacktraces(t);
  backtraces_00.End._M_current = _Var9._M_current;
  backtraces_00.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_00,local_108,false);
  cVar10 = cmTarget::GetCompileFeaturesEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetCompileFeaturesBacktraces(t);
  backtraces_01.End._M_current = _Var9._M_current;
  backtraces_01.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_01,local_110,false);
  cVar10 = cmTarget::GetCompileDefinitionsEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetCompileDefinitionsBacktraces(t);
  backtraces_02.End._M_current = _Var9._M_current;
  backtraces_02.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_02,local_118,false);
  cVar10 = cmTarget::GetLinkOptionsEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetLinkOptionsBacktraces(t);
  backtraces_03.End._M_current = _Var9._M_current;
  backtraces_03.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_03,local_120,false);
  cVar10 = cmTarget::GetLinkDirectoriesEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetLinkDirectoriesBacktraces(t);
  backtraces_04.End._M_current = _Var9._M_current;
  backtraces_04.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_04,&this->LinkDirectoriesEntries,false);
  cVar10 = cmTarget::GetSourceEntries_abi_cxx11_(t);
  cVar11 = cmTarget::GetSourceBacktraces(t);
  backtraces_05.End._M_current = _Var9._M_current;
  backtraces_05.Begin._M_current = cVar11.Begin._M_current._M_current;
  CreatePropertyGeneratorExpressions(cVar10,backtraces_05,&this->SourceEntries,true);
  pcVar6 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_IMPORT_LIBRARY_SUFFIX",local_129);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_50);
  this->DLLPlatform = psVar7->_M_string_length != 0;
  std::__cxx11::string::~string((string *)&local_50);
  pPVar8 = cmTarget::GetPolicyMap(t);
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[4] =
       (pPVar8->Status).super__Base_bitset<5UL>._M_w[4];
  _Var3 = (pPVar8->Status).super__Base_bitset<5UL>._M_w[0];
  _Var4 = (pPVar8->Status).super__Base_bitset<5UL>._M_w[1];
  _Var5 = (pPVar8->Status).super__Base_bitset<5UL>._M_w[3];
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[2] =
       (pPVar8->Status).super__Base_bitset<5UL>._M_w[2];
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[3] = _Var5;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[0] = _Var3;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[1] = _Var4;
  return;
}

Assistant:

cmGeneratorTarget::cmGeneratorTarget(cmTarget* t, cmLocalGenerator* lg)
  : Target(t)
  , FortranModuleDirectoryCreated(false)
  , SourceFileFlagsConstructed(false)
  , PolicyWarnedCMP0022(false)
  , PolicyReportedCMP0069(false)
  , DebugIncludesDone(false)
  , DebugCompileOptionsDone(false)
  , DebugCompileFeaturesDone(false)
  , DebugCompileDefinitionsDone(false)
  , DebugLinkOptionsDone(false)
  , DebugLinkDirectoriesDone(false)
  , DebugSourcesDone(false)
  , LinkImplementationLanguageIsContextDependent(true)
  , UtilityItemsDone(false)
{
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator = lg;
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();

  this->GlobalGenerator->ComputeTargetObjectDirectory(this);

  CreatePropertyGeneratorExpressions(t->GetIncludeDirectoriesEntries(),
                                     t->GetIncludeDirectoriesBacktraces(),
                                     this->IncludeDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileOptionsEntries(),
                                     t->GetCompileOptionsBacktraces(),
                                     this->CompileOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileFeaturesEntries(),
                                     t->GetCompileFeaturesBacktraces(),
                                     this->CompileFeaturesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileDefinitionsEntries(),
                                     t->GetCompileDefinitionsBacktraces(),
                                     this->CompileDefinitionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkOptionsEntries(),
                                     t->GetLinkOptionsBacktraces(),
                                     this->LinkOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkDirectoriesEntries(),
                                     t->GetLinkDirectoriesBacktraces(),
                                     this->LinkDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetSourceEntries(),
                                     t->GetSourceBacktraces(),
                                     this->SourceEntries, true);

  this->DLLPlatform =
    !this->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  this->PolicyMap = t->GetPolicyMap();
}